

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DefaultCaseItemSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DefaultCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  size_t index_local;
  DefaultCaseItemSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->defaultKeyword).kind;
    token._2_1_ = (this->defaultKeyword).field_0x2;
    token.numFlags.raw = (this->defaultKeyword).numFlags.raw;
    token.rawLen = (this->defaultKeyword).rawLen;
    token.info = (this->defaultKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->colon).kind;
    token_00._2_1_ = (this->colon).field_0x2;
    token_00.numFlags.raw = (this->colon).numFlags.raw;
    token_00.rawLen = (this->colon).rawLen;
    token_00.info = (this->colon).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    node = not_null<slang::syntax::SyntaxNode_*>::get(&this->clause);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DefaultCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return defaultKeyword;
        case 1: return colon;
        case 2: return clause.get();
        default: return nullptr;
    }
}